

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int sign_certificate(ptls_sign_certificate_t *_self,ptls_t *tls,ptls_async_job_t **async,
                    uint16_t *selected_algorithm,ptls_buffer_t *outbuf,ptls_iovec_t input,
                    uint16_t *algorithms,size_t num_algorithms)

{
  uint16_t *puVar1;
  EVP_PKEY *pkey;
  uint8_t *puVar2;
  ptls_openssl_signature_scheme_t *ppVar3;
  int iVar4;
  int iVar5;
  EVP_MD *type;
  EVP_MD_CTX *ctx;
  ptls_async_job_t *ppVar6;
  ptls_openssl_signature_scheme_t *ppVar7;
  size_t sVar8;
  ptls_buffer_t *ppVar9;
  uint16_t uVar10;
  int iVar11;
  ptls_openssl_signature_scheme_t *in_R10;
  bool bVar12;
  bool bVar13;
  size_t local_58;
  ptls_buffer_t *local_50;
  EVP_PKEY_CTX *local_48;
  uint8_t *local_40;
  size_t local_38;
  
  if ((async != (ptls_async_job_t **)0x0) && (*async != (ptls_async_job_t *)0x0)) {
    *selected_algorithm = *(uint16_t *)(*async)[1].destroy_;
    iVar4 = do_sign_async(outbuf,async);
    return iVar4;
  }
  ppVar7 = (ptls_openssl_signature_scheme_t *)_self[2].cb;
  uVar10 = ppVar7->scheme_id;
  if (uVar10 != 0xffff) {
    bVar12 = num_algorithms == 0;
    tls = (ptls_t *)CONCAT71((int7)((ulong)tls >> 8),bVar12);
    do {
      ppVar3 = in_R10;
      bVar13 = bVar12;
      if ((num_algorithms != 0) && (ppVar3 = ppVar7, *algorithms != uVar10)) {
        sVar8 = 1;
        do {
          bVar13 = num_algorithms == sVar8;
          ppVar3 = in_R10;
          if (bVar13) break;
          puVar1 = algorithms + sVar8;
          sVar8 = sVar8 + 1;
          ppVar3 = ppVar7;
        } while (*puVar1 != uVar10);
      }
      in_R10 = ppVar3;
      if (!bVar13) goto LAB_001262f2;
      uVar10 = ppVar7[1].scheme_id;
      ppVar7 = ppVar7 + 1;
    } while (uVar10 != 0xffff);
  }
  in_R10 = (ptls_openssl_signature_scheme_t *)0x0;
LAB_001262f2:
  if (in_R10 == (ptls_openssl_signature_scheme_t *)0x0) {
    return 0x28;
  }
  *selected_algorithm = in_R10->scheme_id;
  if ((async != (ptls_async_job_t **)0x0) && (((ulong)_self[3].cb & 1) == 0)) {
    if (*async != (ptls_async_job_t *)0x0) {
      __assert_fail("*async == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/openssl.c",
                    0x5ea,
                    "int sign_certificate(ptls_sign_certificate_t *, ptls_t *, ptls_async_job_t **, uint16_t *, ptls_buffer_t *, ptls_iovec_t, const uint16_t *, size_t)"
                   );
    }
    async = (ptls_async_job_t **)0x0;
  }
  pkey = (EVP_PKEY *)_self[1].cb;
  local_40 = input.base;
  local_38 = input.len;
  local_50 = outbuf;
  if (in_R10->scheme_md == (_func_EVP_MD_ptr *)0x0) {
    type = (EVP_MD *)0x0;
  }
  else {
    type = (EVP_MD *)(*in_R10->scheme_md)(_self,tls);
  }
  ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
  iVar4 = 0x201;
  if (ctx != (EVP_MD_CTX *)0x0) {
    iVar5 = EVP_DigestSignInit(ctx,&local_48,type,(ENGINE *)0x0,pkey);
    iVar11 = 0x203;
    iVar4 = iVar11;
    if (iVar5 == 1) {
      iVar5 = EVP_PKEY_get_id(pkey);
      sVar8 = local_38;
      puVar2 = local_40;
      if (iVar5 == 0x43f) {
        iVar5 = EVP_DigestSign(ctx,0,&local_58,local_40,local_38);
        ppVar9 = local_50;
        if ((iVar5 != 1) || (iVar4 = ptls_buffer_reserve(local_50,local_58), iVar4 != 0))
        goto LAB_001264b8;
        iVar5 = EVP_DigestSign(ctx,ppVar9->base + ppVar9->off,&local_58,puVar2,sVar8);
      }
      else {
        iVar5 = EVP_PKEY_get_id(pkey);
        if (((iVar5 == 6) &&
            (((iVar5 = EVP_PKEY_CTX_set_rsa_padding(local_48,6), iVar5 != 1 ||
              (iVar5 = EVP_PKEY_CTX_set_rsa_pss_saltlen(local_48,0xffffffff), iVar5 != 1)) ||
             (iVar5 = EVP_PKEY_CTX_set_rsa_mgf1_md(local_48,type), iVar5 != 1)))) ||
           ((iVar5 = EVP_DigestSignUpdate(ctx,local_40,local_38), iVar5 != 1 ||
            (iVar5 = EVP_DigestSignFinal(ctx,(uchar *)0x0,&local_58), ppVar9 = local_50, iVar5 != 1)
            ))) goto LAB_001264b8;
        if (async != (ptls_async_job_t **)0x0) {
          ppVar6 = async_sign_ctx_new(in_R10,(EVP_MD_CTX *)ctx,local_58);
          *async = ppVar6;
          iVar4 = 0x201;
          if (ppVar6 != (ptls_async_job_t *)0x0) {
            iVar4 = do_sign_async(local_50,async);
            return iVar4;
          }
          goto LAB_001264b8;
        }
        iVar4 = ptls_buffer_reserve(local_50,local_58);
        if (iVar4 != 0) goto LAB_001264b8;
        iVar5 = EVP_DigestSignFinal(ctx,ppVar9->base + ppVar9->off,&local_58);
      }
      iVar4 = iVar11;
      if (iVar5 == 1) {
        ppVar9->off = ppVar9->off + local_58;
        iVar4 = 0;
      }
    }
  }
LAB_001264b8:
  if (ctx != (EVP_MD_CTX *)0x0) {
    EVP_MD_CTX_free(ctx);
  }
  return iVar4;
}

Assistant:

static int sign_certificate(ptls_sign_certificate_t *_self, ptls_t *tls, ptls_async_job_t **async, uint16_t *selected_algorithm,
                            ptls_buffer_t *outbuf, ptls_iovec_t input, const uint16_t *algorithms, size_t num_algorithms)
{
    ptls_openssl_sign_certificate_t *self = (ptls_openssl_sign_certificate_t *)_self;
    const ptls_openssl_signature_scheme_t *scheme;

    /* Just resume the asynchronous operation, if one is in flight. */
#if PTLS_OPENSSL_HAVE_ASYNC
    if (async != NULL && *async != NULL) {
        struct async_sign_ctx *sign_ctx = (struct async_sign_ctx *)(*async);
        *selected_algorithm = sign_ctx->scheme->scheme_id;
        return do_sign_async(outbuf, async);
    }
#endif

    /* Select the algorithm or return failure if none found. */
    if ((scheme = ptls_openssl_select_signature_scheme(self->schemes, algorithms, num_algorithms)) == NULL)
        return PTLS_ALERT_HANDSHAKE_FAILURE;
    *selected_algorithm = scheme->scheme_id;

#if PTLS_OPENSSL_HAVE_ASYNC
    if (!self->async && async != NULL) {
        /* indicate to `do_sign` that async mode is disabled for this operation */
        assert(*async == NULL);
        async = NULL;
    }
#endif
    return do_sign(self->key, scheme, outbuf, input, async);
}